

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

Optional<unsigned_long> __thiscall llvm::DWARFDie::getHighPC(DWARFDie *this,uint64_t LowPC)

{
  DWARFFormValue *pDVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  ulong uVar5;
  OptionalStorage<unsigned_long,_true> OVar6;
  Optional<unsigned_long> OVar7;
  undefined1 local_60 [8];
  Optional<llvm::DWARFFormValue> FormValue;
  Optional<unsigned_long> Offset;
  
  find((Optional<llvm::DWARFFormValue> *)local_60,this,DW_AT_high_pc);
  if (FormValue.Storage.field_0._40_1_ == '\x01') {
    pDVar1 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                       ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_60);
    OVar6 = (OptionalStorage<unsigned_long,_true>)DWARFFormValue::getAsAddress(pDVar1);
    uVar5 = OVar6.field_0.value >> 8;
    if (((undefined1  [16])OVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pDVar1 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_60);
      OVar7 = DWARFFormValue::getAsUnsignedConstant(pDVar1);
      FormValue.Storage._48_8_ = OVar7.Storage.field_0;
      if (((undefined1  [16])OVar7.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_00d955fd;
      puVar2 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&FormValue.Storage.hasVal);
      uVar5 = LowPC + *puVar2 >> 8;
      OVar6._9_7_ = (int7)((ulong)extraout_RDX >> 8);
      OVar6.hasVal = true;
      OVar6.field_0.value = LowPC + *puVar2;
    }
    uVar4 = OVar6._8_8_;
    uVar3 = (ulong)OVar6.field_0._0_1_;
  }
  else {
    uVar5 = 0;
LAB_00d955fd:
    uVar3 = 0;
    uVar4 = 0;
  }
  OVar7.Storage._8_8_ = uVar4;
  OVar7.Storage.field_0.value = uVar5 << 8 | uVar3;
  return (Optional<unsigned_long>)OVar7.Storage;
}

Assistant:

Optional<uint64_t> DWARFDie::getHighPC(uint64_t LowPC) const {
  if (auto FormValue = find(DW_AT_high_pc)) {
    if (auto Address = FormValue->getAsAddress()) {
      // High PC is an address.
      return Address;
    }
    if (auto Offset = FormValue->getAsUnsignedConstant()) {
      // High PC is an offset from LowPC.
      return LowPC + *Offset;
    }
  }
  return None;
}